

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

bool Js::JavascriptNumber::IsInt32OrUInt32_NoChecks(Var number)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  Var number_local;
  
  if (number == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x9c,"(number)","number");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Is(number);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x9d,"(Is(number))","Is(number)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  value = GetValue(number);
  bVar2 = IsInt32OrUInt32(value);
  return bVar2;
}

Assistant:

bool JavascriptNumber::IsInt32OrUInt32_NoChecks(const Var number)
    {
        Assert(number);
        Assert(Is(number));

        return IsInt32OrUInt32(GetValue(number));
    }